

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setSizeIncrement(QWidget *this,int w,int h)

{
  bool bVar1;
  QWidgetPrivate *this_00;
  QTLWExtra *this_01;
  int in_EDX;
  int in_ESI;
  QTLWExtra *x;
  QWidgetPrivate *d;
  QWidgetPrivate *in_stack_ffffffffffffffe0;
  
  this_00 = d_func((QWidget *)0x36b593);
  QWidgetPrivate::createTLExtra(this_00);
  this_01 = QWidgetPrivate::topData(in_stack_ffffffffffffffe0);
  if ((this_01->incw != in_ESI) || (this_01->inch != in_EDX)) {
    this_01->incw = (short)in_ESI;
    this_01->inch = (short)in_EDX;
    bVar1 = isWindow((QWidget *)this_01);
    if (bVar1) {
      QWidgetPrivate::setConstraints_sys((QWidgetPrivate *)x);
    }
  }
  return;
}

Assistant:

void QWidget::setSizeIncrement(int w, int h)
{
    Q_D(QWidget);
    d->createTLExtra();
    QTLWExtra* x = d->topData();
    if (x->incw == w && x->inch == h)
        return;
    x->incw = w;
    x->inch = h;
    if (isWindow())
        d->setConstraints_sys();
}